

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdGetMnemonicWords(void *handle,char *language,char **mnemonic_words)

{
  bool bVar1;
  char *pcVar2;
  allocator local_92;
  HDWalletApi api;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  wordlist;
  string lang;
  string local_58;
  string words;
  
  cfd::Initialize();
  lang._M_dataplus._M_p = (pointer)&lang.field_2;
  lang._M_string_length = 0;
  lang.field_2._M_local_buf[0] = '\0';
  bVar1 = cfd::capi::IsEmptyString(language);
  if (!bVar1) {
    std::__cxx11::string::assign((char *)&lang);
  }
  cfd::api::HDWalletApi::GetMnemonicWordlist(&wordlist,&api,&lang);
  std::__cxx11::string::string((string *)&local_58," ",&local_92);
  cfd::core::StringUtil::Join
            ((string *)&words,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&wordlist,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pcVar2 = cfd::capi::CreateString(&words);
  *mnemonic_words = pcVar2;
  std::__cxx11::string::~string((string *)&words);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&wordlist);
  std::__cxx11::string::~string((string *)&lang);
  return 0;
}

Assistant:

int CfdGetMnemonicWords(
    void* handle, const char* language, char** mnemonic_words) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();

    std::string lang;
    if (!IsEmptyString(language)) {
      lang = language;
    }
    HDWalletApi api;
    std::vector<std::string> wordlist = api.GetMnemonicWordlist(lang);
    auto words = StringUtil::Join(wordlist, " ");
    *mnemonic_words = CreateString(words);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}